

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O3

int http_ReadHttpResponse(void *Handle,char *buf,size_t *size,int timeout)

{
  uint uVar1;
  int iVar2;
  parse_status_t pVar3;
  ulong uVar4;
  size_t __n;
  long lVar5;
  int iVar6;
  char tempbuf [2048];
  int local_84c;
  http_parser_t *local_848;
  membuffer *local_840;
  char local_838 [2056];
  
  if (size == (size_t *)0x0 || Handle == (void *)0x0) {
    if (size == (size_t *)0x0) {
      return -0x65;
    }
  }
  else if ((buf != (char *)0x0) || (*size == 0)) {
    local_848 = (http_parser_t *)((long)Handle + 0x90);
    iVar6 = 0;
    local_84c = timeout;
    if (*(int *)((long)Handle + 0x248) != 4) {
      pVar3 = parser_parse_entity(local_848);
      if ((PARSE_CONTINUE_1 < pVar3) || ((0x47U >> (pVar3 & 0x1f) & 1) == 0)) {
LAB_001193c1:
        *size = 0;
        return -0x71;
      }
      iVar6 = *(int *)(&DAT_0012e160 + (ulong)pVar3 * 4);
    }
    lVar5 = *(long *)((long)Handle + 400);
    uVar4 = *(ulong *)((long)Handle + 0x210);
    __n = *size;
    if (uVar4 < __n + lVar5) {
      local_840 = (membuffer *)((long)Handle + 0x218);
      do {
        if (*(int *)((long)Handle + 0x284) != 0) {
          return -0xd2;
        }
        if (*(int *)((long)Handle + 0x248) == 4) {
          __n = uVar4 - lVar5;
          *size = __n;
          goto LAB_001193e1;
        }
        uVar1 = sock_read((SOCKINFO *)Handle,local_838,0x800,&local_84c);
        if ((int)uVar1 < 1) {
          if (uVar1 != 0) {
            *size = 0;
            return uVar1;
          }
          if (iVar6 == 0) {
            *size = 0;
            *(undefined4 *)((long)Handle + 0x240) = 400;
            return -0x77;
          }
          UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x612,
                     "<<< (RECVD) <<<\n%s\n-----------------\n",
                     *(undefined8 *)((long)Handle + 0x218));
          *(undefined4 *)((long)Handle + 0x248) = 4;
          iVar2 = 1;
        }
        else {
          iVar2 = membuffer_append(local_840,local_838,(ulong)uVar1);
          if (iVar2 != 0) {
            *(undefined4 *)((long)Handle + 0x240) = 500;
            *size = 0;
            return 3;
          }
          pVar3 = parser_parse_entity(local_848);
          iVar2 = iVar6;
          if (((PARSE_INCOMPLETE < pVar3) && (iVar2 = 1, pVar3 != PARSE_INCOMPLETE_ENTITY)) &&
             (iVar2 = iVar6, pVar3 != PARSE_CONTINUE_1)) goto LAB_001193c1;
        }
        iVar6 = iVar2;
        lVar5 = *(long *)((long)Handle + 400);
        uVar4 = *(ulong *)((long)Handle + 0x210);
        __n = *size;
      } while (uVar4 < __n + lVar5);
    }
    if (*(int *)((long)Handle + 0x284) != 0) {
      return -0xd2;
    }
LAB_001193e1:
    if (__n != 0) {
      memcpy(buf,(void *)(*(long *)((long)Handle + 0x218) + *(long *)((long)Handle + 0x260)),__n);
      membuffer_delete((membuffer *)((long)Handle + 0x218),*(size_t *)((long)Handle + 0x260),*size);
      *(long *)((long)Handle + 0x270) = *(long *)((long)Handle + 0x270) - *size;
      *(long *)((long)Handle + 400) = *(long *)((long)Handle + 400) + *size;
      return 0;
    }
    return 0;
  }
  *size = 0;
  return -0x65;
}

Assistant:

int http_ReadHttpResponse(void *Handle, char *buf, size_t *size, int timeout)
{
	http_connection_handle_t *handle = Handle;
	parse_status_t status;
	int num_read;
	int ok_on_close = 0;
	char tempbuf[2 * 1024];
	int ret_code = 0;

	if (!handle || !size || (*size > 0 && !buf)) {
		if (size)
			*size = 0;
		return UPNP_E_INVALID_PARAM;
	}
	/* first parse what has already been gotten */
	if (handle->response.position != POS_COMPLETE)
		status = parser_parse_entity(&handle->response);
	else
		status = PARSE_SUCCESS;
	if (status == PARSE_INCOMPLETE_ENTITY)
		/* read until close */
		ok_on_close = 1;
	else if ((status != PARSE_SUCCESS) && (status != PARSE_CONTINUE_1) &&
		 (status != PARSE_INCOMPLETE)) {
		/*error */
		*size = 0;
		return UPNP_E_BAD_RESPONSE;
	}
	/* read more if necessary entity */
	while (handle->response.msg.amount_discarded + *size >
			handle->response.msg.entity.length &&
		!handle->cancel && handle->response.position != POS_COMPLETE) {
		num_read = sock_read(
			&handle->sock_info, tempbuf, sizeof(tempbuf), &timeout);
		if (num_read > 0) {
			/* append data to buffer */
			ret_code = membuffer_append(&handle->response.msg.msg,
				tempbuf,
				(size_t)num_read);
			if (ret_code != 0) {
				/* set failure status */
				handle->response.http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				*size = 0;
				return PARSE_FAILURE;
			}
			status = parser_parse_entity(&handle->response);
			if (status == PARSE_INCOMPLETE_ENTITY) {
				/* read until close */
				ok_on_close = 1;
			} else if ((status != PARSE_SUCCESS) &&
				   (status != PARSE_CONTINUE_1) &&
				   (status != PARSE_INCOMPLETE)) {
				/*error */
				*size = 0;
				return UPNP_E_BAD_RESPONSE;
			}
		} else if (num_read == 0) {
			if (ok_on_close) {
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					handle->response.msg.msg.buf);
				handle->response.position = POS_COMPLETE;
			} else {
				/* partial msg */
				*size = 0;
				handle->response.http_error_code =
					HTTP_BAD_REQUEST; /* or response */
				return UPNP_E_BAD_HTTPMSG;
			}
		} else {
			*size = 0;
			return num_read;
		}
	}
	if (handle->cancel) {
		return UPNP_E_CANCELED;
	}
	/* truncate size to fall within available data */
	if (handle->response.msg.amount_discarded + *size >
		handle->response.msg.entity.length)
		*size = handle->response.msg.entity.length -
			handle->response.msg.amount_discarded;
	/* copy data to user buffer. delete copied data */
	if (*size > 0) {
		memcpy(buf,
			&handle->response.msg.msg
				.buf[handle->response.entity_start_position],
			*size);
		membuffer_delete(&handle->response.msg.msg,
			handle->response.entity_start_position,
			*size);
		/* update scanner position. needed for chunked transfers */
		handle->response.scanner.cursor -= *size;
		/* update amount discarded */
		handle->response.msg.amount_discarded += *size;
	}

	return UPNP_E_SUCCESS;
}